

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Rectangle GetImageAlphaBorder(Image image,float threshold)

{
  Image image_00;
  Rectangle RVar1;
  Color *colors;
  undefined8 in_stack_ffffffffffffffa0;
  int local_40;
  int local_3c;
  int x;
  int y;
  int yMax;
  int yMin;
  int xMax;
  int xMin;
  Color *pixels;
  undefined4 uStack_18;
  float threshold_local;
  Rectangle crop;
  
  memset(&stack0xffffffffffffffe8,0,0x10);
  image_00.mipmaps = (int)in_stack_ffffffffffffffa0;
  image_00.format = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  image_00._0_16_ = image._8_16_;
  colors = LoadImageColors(image_00);
  if (colors != (Color *)0x0) {
    yMin = 0x10000;
    yMax = 0;
    y = 0x10000;
    x = 0;
    for (local_3c = 0; local_3c < image.height; local_3c = local_3c + 1) {
      for (local_40 = 0; local_40 < image.width; local_40 = local_40 + 1) {
        if (((int)(threshold * 255.0) & 0xffU) < (uint)colors[local_3c * image.width + local_40].a)
        {
          if (local_40 < yMin) {
            yMin = local_40;
          }
          if (yMax < local_40) {
            yMax = local_40;
          }
          if (local_3c < y) {
            y = local_3c;
          }
          if (x < local_3c) {
            x = local_3c;
          }
        }
      }
    }
    if ((yMin != 0x10000) && (yMax != 0x10000)) {
      _uStack_18 = CONCAT44((float)y,(float)yMin);
      crop.y = (float)((x + 1) - y);
      crop.x = (float)((yMax + 1) - yMin);
    }
    UnloadImageColors(colors);
  }
  RVar1.width = crop.x;
  RVar1.height = crop.y;
  RVar1.x = (float)uStack_18;
  RVar1.y = threshold_local;
  return RVar1;
}

Assistant:

Rectangle GetImageAlphaBorder(Image image, float threshold)
{
    Rectangle crop = { 0 };

    Color *pixels = LoadImageColors(image);

    if (pixels != NULL)
    {
        int xMin = 65536;   // Define a big enough number
        int xMax = 0;
        int yMin = 65536;
        int yMax = 0;

        for (int y = 0; y < image.height; y++)
        {
            for (int x = 0; x < image.width; x++)
            {
                if (pixels[y*image.width + x].a > (unsigned char)(threshold*255.0f))
                {
                    if (x < xMin) xMin = x;
                    if (x > xMax) xMax = x;
                    if (y < yMin) yMin = y;
                    if (y > yMax) yMax = y;
                }
            }
        }

        // Check for empty blank image
        if ((xMin != 65536) && (xMax != 65536))
        {
            crop = (Rectangle){ (float)xMin, (float)yMin, (float)((xMax + 1) - xMin), (float)((yMax + 1) - yMin) };
        }

        UnloadImageColors(pixels);
    }

    return crop;
}